

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_prefix(FuncState *fs,UnOpr opr,expdesc *e,int line)

{
  int iVar1;
  int iVar2;
  
  luaK_dischargevars(fs,e);
  if (opr < OPR_NOT) {
    iVar2 = constfolding(fs,opr + 0xc,e,&luaK_prefix::ef);
    if (iVar2 != 0) {
      return;
    }
  }
  else {
    if (opr == OPR_NOT) {
      switch(e->k) {
      case VNIL:
      case VFALSE:
        e->k = VTRUE;
        break;
      case VTRUE:
      case VK:
      case VKFLT:
      case VKINT:
      case VKSTR:
        e->k = VFALSE;
        break;
      case VNONRELOC:
      case VRELOC:
        discharge2anyreg(fs,e);
        freeexp(fs,e);
        iVar2 = luaK_code(fs,(e->u).info << 0x10 | 0x33);
        (e->u).info = iVar2;
        e->k = VRELOC;
        break;
      case VJMP:
        negatecondition(fs,e);
      }
      iVar2 = e->t;
      iVar1 = e->f;
      e->f = iVar2;
      e->t = iVar1;
      removevalues(fs,iVar2);
      removevalues(fs,e->t);
      return;
    }
    if (opr != OPR_LEN) {
      return;
    }
  }
  iVar2 = luaK_exp2anyreg(fs,e);
  freeexp(fs,e);
  iVar2 = luaK_code(fs,iVar2 << 0x10 | opr + 0x31);
  (e->u).info = iVar2;
  e->k = VRELOC;
  luaK_fixline(fs,line);
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr opr, expdesc *e, int line) {
  static const expdesc ef = {VKINT, {0}, NO_JUMP, NO_JUMP};
  luaK_dischargevars(fs, e);
  switch (opr) {
    case OPR_MINUS: case OPR_BNOT:  /* use 'ef' as fake 2nd operand */
      if (constfolding(fs, cast_int(opr + LUA_OPUNM), e, &ef))
        break;
      /* else */ /* FALLTHROUGH */
    case OPR_LEN:
      codeunexpval(fs, unopr2op(opr), e, line);
      break;
    case OPR_NOT: codenot(fs, e); break;
    default: lua_assert(0);
  }
}